

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall Highs::handleInfCost(Highs *this)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  ObjSense OVar3;
  bool bVar4;
  vector<double,_std::allocator<double>_> *pvVar5;
  char *format;
  HighsInt k;
  int iVar6;
  double dVar7;
  uint local_8c;
  double upper;
  double lower;
  double cost;
  vector<double,_std::allocator<double>_> *local_70;
  vector<double,_std::allocator<double>_> *local_68;
  vector<int,_std::allocator<int>_> *local_60;
  double local_58;
  undefined8 uStack_50;
  double local_48;
  undefined8 uStack_40;
  
  if ((this->model_).lp_.has_infinite_cost_ == true) {
    local_48 = (this->options_).super_HighsOptionsStruct.infinite_cost;
    uStack_40 = 0;
    local_58 = -local_48;
    uStack_50 = 0x8000000000000000;
    pvVar1 = &(this->model_).lp_.col_lower_;
    pvVar2 = &(this->model_).lp_.col_upper_;
    local_60 = &(this->model_).lp_.mods_.save_inf_cost_variable_index;
    local_68 = &(this->model_).lp_.mods_.save_inf_cost_variable_cost;
    local_70 = &(this->model_).lp_.mods_.save_inf_cost_variable_lower;
    for (iVar6 = 0; iVar6 != 2; iVar6 = iVar6 + 1) {
      for (local_8c = 0; (int)local_8c < (this->model_).lp_.num_col_; local_8c = local_8c + 1) {
        cost = (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[(int)local_8c];
        if ((cost <= local_58) || (local_48 <= cost)) {
          lower = (pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[(int)local_8c];
          upper = (pvVar2->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start[(int)local_8c];
          bVar4 = HighsLp::isMip(&(this->model_).lp_);
          if ((bVar4) &&
             ((this->model_).lp_.integrality_.
              super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
              super__Vector_impl_data._M_start[(int)local_8c] == kInteger)) {
            lower = ceil(lower);
            upper = floor(upper);
          }
          OVar3 = (this->model_).lp_.sense_;
          pvVar5 = pvVar1;
          dVar7 = upper;
          if (cost <= local_58) {
            if (OVar3 == kMinimize) {
              if (upper == INFINITY) {
                format = "Cannot minimize with a cost on variable %d of %g and upper bound of %g\n";
                goto LAB_0025521b;
              }
            }
            else {
              pvVar5 = pvVar2;
              dVar7 = lower;
              if (lower == -INFINITY) {
                format = "Cannot maximize with a cost on variable %d of %g and lower bound of %g\n";
                goto LAB_0025521b;
              }
            }
          }
          else if (OVar3 == kMinimize) {
            pvVar5 = pvVar2;
            dVar7 = lower;
            if (lower == -INFINITY) {
              format = "Cannot minimize with a cost on variable %d of %g and lower bound of %g\n";
LAB_0025521b:
              highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,format,
                           (ulong)local_8c);
              return kError;
            }
          }
          else if (upper == INFINITY) {
            format = "Cannot maximize with a cost on variable %d of %g and upper bound of %g\n";
            goto LAB_0025521b;
          }
          if (iVar6 != 0) {
            (pvVar5->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[(int)local_8c] = dVar7;
            std::vector<int,_std::allocator<int>_>::push_back
                      (local_60,(value_type_conflict2 *)&local_8c);
            std::vector<double,_std::allocator<double>_>::push_back(local_68,&cost);
            std::vector<double,_std::allocator<double>_>::push_back(local_70,&lower);
            std::vector<double,_std::allocator<double>_>::push_back
                      (&(this->model_).lp_.mods_.save_inf_cost_variable_upper,&upper);
            (this->model_).lp_.col_cost_.super__Vector_base<double,_std::allocator<double>_>._M_impl
            .super__Vector_impl_data._M_start[(int)local_8c] = 0.0;
          }
        }
      }
    }
    (this->model_).lp_.has_infinite_cost_ = false;
  }
  return kOk;
}

Assistant:

HighsStatus Highs::handleInfCost() {
  HighsLp& lp = this->model_.lp_;
  if (!lp.has_infinite_cost_) return HighsStatus::kOk;
  HighsLpMods& mods = lp.mods_;
  double inf_cost = this->options_.infinite_cost;
  for (HighsInt k = 0; k < 2; k++) {
    // Pass twice: first checking that infinite costs can be handled,
    // then handling them, so that model is unmodified if infinite
    // costs cannot be handled
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
      double cost = lp.col_cost_[iCol];
      if (cost > -inf_cost && cost < inf_cost) continue;
      double lower = lp.col_lower_[iCol];
      double upper = lp.col_upper_[iCol];
      if (lp.isMip()) {
        if (lp.integrality_[iCol] == HighsVarType::kInteger) {
          lower = std::ceil(lower);
          upper = std::floor(upper);
        }
      }
      if (cost <= -inf_cost) {
        if (lp.sense_ == ObjSense::kMinimize) {
          // Minimizing with -inf cost so try to fix at upper bound
          if (upper < kHighsInf) {
            if (k) lp.col_lower_[iCol] = upper;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot minimize with a cost on variable %d of %g and "
                         "upper bound of %g\n",
                         int(iCol), cost, upper);
            return HighsStatus::kError;
          }
        } else {
          // Maximizing with -inf cost so try to fix at lower bound
          if (lower > -kHighsInf) {
            if (k) lp.col_upper_[iCol] = lower;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot maximize with a cost on variable %d of %g and "
                         "lower bound of %g\n",
                         int(iCol), cost, lower);
            return HighsStatus::kError;
          }
        }
      } else {
        if (lp.sense_ == ObjSense::kMinimize) {
          // Minimizing with inf cost so try to fix at lower bound
          if (lower > -kHighsInf) {
            if (k) lp.col_upper_[iCol] = lower;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot minimize with a cost on variable %d of %g and "
                         "lower bound of %g\n",
                         int(iCol), cost, lower);
            return HighsStatus::kError;
          }
        } else {
          // Maximizing with inf cost so try to fix at upper bound
          if (upper < kHighsInf) {
            if (k) lp.col_lower_[iCol] = upper;
          } else {
            highsLogUser(options_.log_options, HighsLogType::kError,
                         "Cannot maximize with a cost on variable %d of %g and "
                         "upper bound of %g\n",
                         int(iCol), cost, upper);
            return HighsStatus::kError;
          }
        }
      }
      if (k) {
        mods.save_inf_cost_variable_index.push_back(iCol);
        mods.save_inf_cost_variable_cost.push_back(cost);
        mods.save_inf_cost_variable_lower.push_back(lower);
        mods.save_inf_cost_variable_upper.push_back(upper);
        lp.col_cost_[iCol] = 0;
      }
    }
  }
  // Infinite costs have been removed, but their presence in the
  // original model is known from mods.save_inf_cost_variable_*, so
  // set lp.has_infinite_cost_ to be false to avoid assert when run()
  // is called using copy of model in MIP solver (See #1446)
  lp.has_infinite_cost_ = false;

  return HighsStatus::kOk;
}